

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::make_string(uint argc)

{
  uint uVar1;
  int iVar2;
  vm_obj_id_t obj;
  vm_val_t *pvVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  int idx;
  ulong uVar8;
  char *p;
  bool bVar9;
  uint local_6c;
  vm_val_t val;
  vm_val_t ele_val;
  
  idx = 1;
  CVmBif::check_argc_range(argc,1,2);
  pvVar3 = sp_ + -1;
  val.typ = sp_[-1].typ;
  val._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  val.val = sp_[-1].val;
  if (argc < 2) {
    uVar6 = 1;
  }
  else {
    sp_ = pvVar3;
    uVar1 = CVmBif::pop_long_val();
    if ((int)uVar1 < 0) goto LAB_002232fb;
    uVar6 = (ulong)uVar1;
    pvVar3 = sp_;
  }
  sp_ = pvVar3 + 1;
  pvVar3->typ = val.typ;
  *(undefined4 *)&pvVar3->field_0x4 = val._4_4_;
  pvVar3->val = val.val;
  switch(val.typ) {
  case VM_OBJ:
    puVar7 = (ushort *)vm_val_t::get_as_string(&val);
    if (puVar7 != (ushort *)0x0) goto LAB_0022315e;
    iVar2 = vm_val_t::is_listlike(&val);
    if ((iVar2 == 0) || (local_6c = vm_val_t::ll_length(&val), (int)local_6c < 0))
    goto switchD_002230fa_caseD_6;
    break;
  default:
switchD_002230fa_caseD_6:
    err_throw(0x900);
  case VM_INT:
    uVar8 = 1;
    if (0x7f < val.val.intval) {
      uVar8 = 3 - (ulong)(val.val.obj < 0x800);
    }
    local_6c = 0xffffffff;
    goto LAB_002231f3;
  case VM_SSTRING:
    puVar7 = (ushort *)
             (G_const_pool_X.super_CVmPoolPaged.pages_
              [val.val.obj >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem
             + (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & val.val.obj));
LAB_0022315e:
    uVar8 = (ulong)*puVar7;
    local_6c = 0xffffffff;
    goto LAB_002231f6;
  case VM_LIST:
    local_6c = vm_val_t::ll_length(&val);
  }
  uVar8 = 0;
  for (; idx <= (int)local_6c; idx = idx + 1) {
    vm_val_t::ll_index(&val,&ele_val,idx);
    if (ele_val.typ != VM_INT) {
      err_throw(0x7d5);
    }
    lVar5 = 3 - (ulong)(ele_val.val.obj < 0x800);
    if (ele_val.val.intval < 0x80) {
      lVar5 = 1;
    }
    uVar8 = uVar8 + lVar5;
  }
LAB_002231f3:
  puVar7 = (ushort *)0x0;
LAB_002231f6:
  if (uVar8 * uVar6 < 0xfffe) {
    obj = CVmObjString::create(0,uVar8 * uVar6);
    p = (char *)(*(long *)((long)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 8) + 2);
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      if ((int)local_6c < 0) {
        if (puVar7 == (ushort *)0x0) {
          uVar8 = utf8_ptr::s_putch(p,val.val.intval);
        }
        else {
          memcpy(p,puVar7 + 1,(ulong)*puVar7);
          uVar8 = (ulong)*puVar7;
        }
        p = p + uVar8;
      }
      else {
        uVar8 = 0;
        while (local_6c != uVar8) {
          uVar8 = uVar8 + 1;
          vm_val_t::ll_index(&val,&ele_val,(int)uVar8);
          sVar4 = utf8_ptr::s_putch(p,ele_val.val.intval);
          p = p + sVar4;
        }
      }
    }
    CVmBif::retval_obj(obj);
    sp_ = sp_ + -1;
    return;
  }
LAB_002232fb:
  err_throw(0x902);
}

Assistant:

void CVmBifTADS::make_string(VMG_ uint argc)
{
    vm_val_t val;
    long rpt;
    vm_obj_id_t new_str_obj;
    CVmObjString *new_str;
    size_t new_str_len;
    char *new_strp;
    const char *strp = 0;
    int lst_len = -1;
    size_t i;
    utf8_ptr dst;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the base value */
    G_stk->pop(&val);

    /* if there's a repeat count, get it */
    rpt = (argc >= 2 ? pop_long_val(vmg0_) : 1);

    /* if the repeat count is less than zero, it's an error */
    if (rpt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* leave the original value on the stack to protect it from GC */
    G_stk->push(&val);

    /* 
     *   see what we have, and calculate how much space we'll need for the
     *   result string 
     */
    switch(val.typ)
    {
    case VM_LIST:
        /* it's a list of integers giving unicode character values */
        lst_len = val.ll_length(vmg0_);

    do_list:
        /* 
         *   Run through the list and get the size of each character, so
         *   we can determine how long the string will have to be. 
         */
        for (new_str_len = 0, i = 1 ; (int)i <= lst_len ; ++i)
        {
            /* get this element */
            vm_val_t ele_val;
            val.ll_index(vmg_ &ele_val, i);

            /* if it's not an integer, it's an error */
            if (ele_val.typ != VM_INT)
                err_throw(VMERR_INT_VAL_REQD);

            /* add this character's byte size to the string size */
            new_str_len +=
                utf8_ptr::s_wchar_size((wchar_t)ele_val.val.intval);
        }
        break;

    case VM_SSTRING:
        /* get the string pointer */
        strp = G_const_pool->get_ptr(val.val.ofs);
        
    do_string:
        /* 
         *   it's a string - the output length is the same as the input
         *   length 
         */
        new_str_len = vmb_get_len(strp);
        break;

    case VM_INT:
        /* 
         *   it's an integer giving a unicode character value - we just
         *   need enough space to store this particular character 
         */
        new_str_len = utf8_ptr::s_wchar_size((wchar_t)val.val.intval);
        break;

    case VM_OBJ:
        /* check to see if it's a string */
        if ((strp = val.get_as_string(vmg0_)) != 0)
            goto do_string;

        /* check to see if it's a list */
        if (val.is_listlike(vmg0_) && (lst_len = val.ll_length(vmg0_)) >= 0)
            goto do_list;

        /* it's invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;

    default:
        /* other types are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;
    }

    /* 
     *   if the length times the repeat count would be over the maximum
     *   16-bit string length, it's an error 
     */
    if (new_str_len * rpt > 0xffffL - VMB_LEN)
        err_throw(VMERR_BAD_VAL_BIF);

    /* multiply the length by the repeat count */
    new_str_len *= rpt;
    
    /* allocate the string and gets its buffer */
    new_str_obj = CVmObjString::create(vmg_ FALSE, new_str_len);
    new_str = (CVmObjString *)vm_objp(vmg_ new_str_obj);
    new_strp = new_str->cons_get_buf();
    
    /* set up the destination pointer */
    dst.set(new_strp);

    /* run through the number of iterations requested */
    for ( ; rpt != 0 ; --rpt)
    {
        /* build one iteration of the string, according to the type */
        if (lst_len >= 0)
        {
            /* run through the list */
            for (i = 1 ; i <= (size_t)lst_len ; ++i)
            {
                /* get this element */
                vm_val_t ele_val;
                val.ll_index(vmg_ &ele_val, i);

                /* add this character to the string */
                dst.setch((wchar_t)ele_val.val.intval);
            }
        }
        else if (strp != 0)
        {
            /* copy the string's contents into the output string */
            memcpy(dst.getptr(), strp + VMB_LEN, vmb_get_len(strp));

            /* advance past the bytes we copied */
            dst.set(dst.getptr() + vmb_get_len(strp));
        }
        else
        {
            /* set this int value */
            dst.setch((wchar_t)val.val.intval);
        }
    }

    /* return the new string */
    retval_obj(vmg_ new_str_obj);

    /* discard the GC protection */
    G_stk->discard();
}